

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

parser_token char_to_token(char c)

{
  ushort **ppuVar1;
  parser_token pVar2;
  undefined3 in_register_00000039;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000039,c);
  if (iVar3 < 0x24) {
    if (iVar3 == 10) {
      return NEW_LINE;
    }
    if (iVar3 == 0x22) {
      return QUOTE;
    }
    if (iVar3 == 0x23) {
      return COMMENT_START;
    }
  }
  else if (iVar3 < 0x5b) {
    if (iVar3 == 0x24) {
      return VARIABLE_START;
    }
    if (iVar3 == 0x3d) {
      return EQUAL;
    }
  }
  else {
    if (iVar3 == 0x5b) {
      return ARRAY_START;
    }
    if (iVar3 == 0x5d) {
      return ARRAY_END;
    }
  }
  ppuVar1 = __ctype_b_loc();
  pVar2 = NUMERIC_CHAR;
  if (((*ppuVar1)[c] >> 0xb & 1) == 0) {
    pVar2 = ~(uint)(*ppuVar1)[c] >> 7 & UNKNOWN;
  }
  return pVar2;
}

Assistant:

enum parser_token char_to_token(char c)
{
        switch (c) {
        case '[':
                return ARRAY_START;
        case ']':
                return ARRAY_END;
        case '#':
                return COMMENT_START;
        case '=':
                return EQUAL;
        case '\n':
                return NEW_LINE;
        case '"':
                return QUOTE;
        case '$':
                return VARIABLE_START;
        default:
                if (isdigit(c)) {
                        return NUMERIC_CHAR;
                }

                if (isalpha(c)) {
                        return ALPHA_CHAR;
                }

                return UNKNOWN;
        }
}